

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

void __thiscall cmELF::cmELF(cmELF *this,char *fname)

{
  string *psVar1;
  _Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false> this_00;
  long *plVar2;
  cmELFInternalImpl<cmELFTypes64> *this_01;
  ByteOrderType order;
  _Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false> local_40;
  char ident [16];
  
  this->Internal = (cmELFInternal *)0x0;
  psVar1 = &this->ErrorMessage;
  (this->ErrorMessage)._M_dataplus._M_p = (pointer)&(this->ErrorMessage).field_2;
  (this->ErrorMessage)._M_string_length = 0;
  (this->ErrorMessage).field_2._M_local_buf[0] = '\0';
  this_00._M_head_impl = (basic_ifstream<char,_std::char_traits<char>_> *)operator_new(0x208);
  std::ifstream::ifstream(this_00._M_head_impl,fname,_S_in);
  local_40._M_head_impl = this_00._M_head_impl;
  if (((byte)(this_00._M_head_impl + 0x20)[*(long *)(*(long *)this_00._M_head_impl + -0x18)] & 5) !=
      0) {
    std::__cxx11::string::assign((char *)psVar1);
    goto LAB_001ea08f;
  }
  plVar2 = (long *)std::istream::read((char *)this_00._M_head_impl,(long)ident);
  if ((((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) &&
      (plVar2 = (long *)std::istream::seekg(this_00._M_head_impl,0,0),
      (*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0)) &&
     (ident._0_4_ == 0x464c457f)) {
    order = (ByteOrderType)(byte)ident[5];
    if (ident[5] == '\x01') {
LAB_001ea046:
      if (ident[4] == '\x02') {
        this_01 = (cmELFInternalImpl<cmELFTypes64> *)operator_new(200);
        cmELFInternalImpl<cmELFTypes64>::cmELFInternalImpl
                  (this_01,this,
                   (unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    *)&local_40,order);
      }
      else {
        if (ident[4] != '\x01') goto LAB_001ea0d9;
        this_01 = (cmELFInternalImpl<cmELFTypes64> *)operator_new(0xc0);
        cmELFInternalImpl<cmELFTypes32>::cmELFInternalImpl
                  ((cmELFInternalImpl<cmELFTypes32> *)this_01,this,
                   (unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    *)&local_40,order);
      }
      this->Internal = &this_01->super_cmELFInternal;
    }
    else {
      if (ident[5] == '\x02') {
        order = ByteOrderMSB;
        goto LAB_001ea046;
      }
LAB_001ea0d9:
      std::__cxx11::string::assign((char *)psVar1);
    }
  }
  else {
    std::__cxx11::string::assign((char *)psVar1);
  }
  this_00._M_head_impl = local_40._M_head_impl;
  if (local_40._M_head_impl == (basic_ifstream<char,_std::char_traits<char>_> *)0x0) {
    return;
  }
LAB_001ea08f:
  (**(code **)(*(long *)this_00._M_head_impl + 8))(this_00._M_head_impl);
  return;
}

Assistant:

cmELF::cmELF(const char* fname)
  : Internal(nullptr)
{
  // Try to open the file.
  std::unique_ptr<cmsys::ifstream> fin(new cmsys::ifstream(fname));

  // Quit now if the file could not be opened.
  if (!fin || !*fin) {
    this->ErrorMessage = "Error opening input file.";
    return;
  }

  // Read the ELF identification block.
  char ident[EI_NIDENT];
  if (!fin->read(ident, EI_NIDENT)) {
    this->ErrorMessage = "Error reading ELF identification.";
    return;
  }
  if (!fin->seekg(0)) {
    this->ErrorMessage = "Error seeking to beginning of file.";
    return;
  }

  // Verify the ELF identification.
  if (!(ident[EI_MAG0] == ELFMAG0 && ident[EI_MAG1] == ELFMAG1 &&
        ident[EI_MAG2] == ELFMAG2 && ident[EI_MAG3] == ELFMAG3)) {
    this->ErrorMessage = "File does not have a valid ELF identification.";
    return;
  }

  // Check the byte order in which the rest of the file is encoded.
  cmELFInternal::ByteOrderType order;
  if (ident[EI_DATA] == ELFDATA2LSB) {
    // File is LSB.
    order = cmELFInternal::ByteOrderLSB;
  } else if (ident[EI_DATA] == ELFDATA2MSB) {
    // File is MSB.
    order = cmELFInternal::ByteOrderMSB;
  } else {
    this->ErrorMessage = "ELF file is not LSB or MSB encoded.";
    return;
  }

  // Check the class of the file and construct the corresponding
  // parser implementation.
  if (ident[EI_CLASS] == ELFCLASS32) {
    // 32-bit ELF
    this->Internal = new cmELFInternalImpl<cmELFTypes32>(this, fin, order);
  }
#ifndef _SCO_DS
  else if (ident[EI_CLASS] == ELFCLASS64) {
    // 64-bit ELF
    this->Internal = new cmELFInternalImpl<cmELFTypes64>(this, fin, order);
  }
#endif
  else {
    this->ErrorMessage = "ELF file class is not 32-bit or 64-bit.";
    return;
  }